

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cave-square.c
# Opt level: O0

void square_destroy(chunk *c,loc_conflict grid)

{
  uint32_t uVar1;
  undefined4 local_1c;
  wchar_t r;
  wchar_t feat;
  chunk *c_local;
  loc_conflict grid_local;
  
  local_1c = L'\x01';
  uVar1 = Rand_div(200);
  if ((int)uVar1 < 0x14) {
    local_1c = L'\x15';
  }
  else if ((int)uVar1 < 0x46) {
    local_1c = L'\x12';
  }
  else if ((int)uVar1 < 100) {
    local_1c = L'\x11';
  }
  square_set_feat(c,grid,local_1c);
  return;
}

Assistant:

void square_destroy(struct chunk *c, struct loc grid) {
	int feat = FEAT_FLOOR;
	int r = randint0(200);

	if (r < 20)
		feat = FEAT_GRANITE;
	else if (r < 70)
		feat = FEAT_QUARTZ;
	else if (r < 100)
		feat = FEAT_MAGMA;

	square_set_feat(c, grid, feat);
}